

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

void __thiscall CaDiCaL::Options::reset_default_values(Options *this)

{
  size_t count;
  Options *this_local;
  
  if (this->arena != 1) {
    this->arena = 1;
  }
  if (this->arenacompact != 1) {
    this->arenacompact = 1;
  }
  if (this->arenasort != 1) {
    this->arenasort = 1;
  }
  if (this->arenatype != 3) {
    this->arenatype = 3;
  }
  if (this->binary != 1) {
    this->binary = 1;
  }
  if (this->block != 0) {
    this->block = 0;
  }
  if (((double)this->blockmaxclslim != 100000.0) || (NAN((double)this->blockmaxclslim))) {
    this->blockmaxclslim = 100000;
  }
  if (this->blockminclslim != 2) {
    this->blockminclslim = 2;
  }
  if (((double)this->blockocclim != 100.0) || (NAN((double)this->blockocclim))) {
    this->blockocclim = 100;
  }
  if (this->bump != 1) {
    this->bump = 1;
  }
  if (this->bumpreason != 1) {
    this->bumpreason = 1;
  }
  if (this->bumpreasondepth != 1) {
    this->bumpreasondepth = 1;
  }
  if (this->chrono != 1) {
    this->chrono = 1;
  }
  if (this->chronoalways != 0) {
    this->chronoalways = 0;
  }
  if (((double)this->chronolevelim != 100.0) || (NAN((double)this->chronolevelim))) {
    this->chronolevelim = 100;
  }
  if (this->chronoreusetrail != 1) {
    this->chronoreusetrail = 1;
  }
  if (this->compact != 1) {
    this->compact = 1;
  }
  if (((double)this->compactint != 2000.0) || (NAN((double)this->compactint))) {
    this->compactint = 2000;
  }
  if (((double)this->compactlim != 100.0) || (NAN((double)this->compactlim))) {
    this->compactlim = 100;
  }
  if (((double)this->compactmin != 100.0) || (NAN((double)this->compactmin))) {
    this->compactmin = 100;
  }
  if (this->condition != 0) {
    this->condition = 0;
  }
  if (((double)this->conditionint != 10000.0) || (NAN((double)this->conditionint))) {
    this->conditionint = 10000;
  }
  if (((double)this->conditionmaxeff != 10000000.0) || (NAN((double)this->conditionmaxeff))) {
    this->conditionmaxeff = 10000000;
  }
  if (this->conditionmaxrat != 100) {
    this->conditionmaxrat = 100;
  }
  if (((double)this->conditionmineff != 1000000.0) || (NAN((double)this->conditionmineff))) {
    this->conditionmineff = 1000000;
  }
  if (this->conditionreleff != 100) {
    this->conditionreleff = 100;
  }
  if (this->cover != 0) {
    this->cover = 0;
  }
  if (((double)this->covermaxclslim != 100000.0) || (NAN((double)this->covermaxclslim))) {
    this->covermaxclslim = 100000;
  }
  if (((double)this->covermaxeff != 100000000.0) || (NAN((double)this->covermaxeff))) {
    this->covermaxeff = 100000000;
  }
  if (this->coverminclslim != 2) {
    this->coverminclslim = 2;
  }
  if (((double)this->covermineff != 1000000.0) || (NAN((double)this->covermineff))) {
    this->covermineff = 1000000;
  }
  if (this->coverreleff != 4) {
    this->coverreleff = 4;
  }
  if (this->decompose != 1) {
    this->decompose = 1;
  }
  if (this->decomposerounds != 2) {
    this->decomposerounds = 2;
  }
  if (this->deduplicate != 1) {
    this->deduplicate = 1;
  }
  if (this->eagersubsume != 1) {
    this->eagersubsume = 1;
  }
  if (this->eagersubsumelim != 0x14) {
    this->eagersubsumelim = 0x14;
  }
  if (this->elim != 1) {
    this->elim = 1;
  }
  if (this->elimands != 1) {
    this->elimands = 1;
  }
  if (((double)this->elimaxeff != 2000000000.0) || (NAN((double)this->elimaxeff))) {
    this->elimaxeff = 2000000000;
  }
  if (this->elimbackward != 1) {
    this->elimbackward = 1;
  }
  if (this->elimboundmax != 0x10) {
    this->elimboundmax = 0x10;
  }
  if (this->elimboundmin != 0) {
    this->elimboundmin = 0;
  }
  if (((double)this->elimclslim != 100.0) || (NAN((double)this->elimclslim))) {
    this->elimclslim = 100;
  }
  if (this->elimequivs != 1) {
    this->elimequivs = 1;
  }
  if (((double)this->elimineff != 10000000.0) || (NAN((double)this->elimineff))) {
    this->elimineff = 10000000;
  }
  if (((double)this->elimint != 2000.0) || (NAN((double)this->elimint))) {
    this->elimint = 2000;
  }
  if (this->elimites != 1) {
    this->elimites = 1;
  }
  if (this->elimlimited != 1) {
    this->elimlimited = 1;
  }
  if (((double)this->elimocclim != 100.0) || (NAN((double)this->elimocclim))) {
    this->elimocclim = 100;
  }
  if (this->elimprod != 1) {
    this->elimprod = 1;
  }
  if (((double)this->elimreleff != 1000.0) || (NAN((double)this->elimreleff))) {
    this->elimreleff = 1000;
  }
  if (this->elimrounds != 2) {
    this->elimrounds = 2;
  }
  if (this->elimsubst != 1) {
    this->elimsubst = 1;
  }
  if (this->elimsum != 1) {
    this->elimsum = 1;
  }
  if (this->elimxorlim != 5) {
    this->elimxorlim = 5;
  }
  if (this->elimxors != 1) {
    this->elimxors = 1;
  }
  if (this->emagluefast != 0x21) {
    this->emagluefast = 0x21;
  }
  if (((double)this->emaglueslow != 100000.0) || (NAN((double)this->emaglueslow))) {
    this->emaglueslow = 100000;
  }
  if (((double)this->emajump != 100000.0) || (NAN((double)this->emajump))) {
    this->emajump = 100000;
  }
  if (((double)this->emalevel != 100000.0) || (NAN((double)this->emalevel))) {
    this->emalevel = 100000;
  }
  if (((double)this->emasize != 100000.0) || (NAN((double)this->emasize))) {
    this->emasize = 100000;
  }
  if (((double)this->ematrailfast != 100.0) || (NAN((double)this->ematrailfast))) {
    this->ematrailfast = 100;
  }
  if (((double)this->ematrailslow != 100000.0) || (NAN((double)this->ematrailslow))) {
    this->ematrailslow = 100000;
  }
  if (this->exteagerreasons != 1) {
    this->exteagerreasons = 1;
  }
  if (this->exteagerrecalc != 1) {
    this->exteagerrecalc = 1;
  }
  if (this->externallrat != 0) {
    this->externallrat = 0;
  }
  if (this->flush != 0) {
    this->flush = 0;
  }
  if (this->flushfactor != 3) {
    this->flushfactor = 3;
  }
  if (((double)this->flushint != 100000.0) || (NAN((double)this->flushint))) {
    this->flushint = 100000;
  }
  if (this->forcephase != 0) {
    this->forcephase = 0;
  }
  if (this->frat != 0) {
    this->frat = 0;
  }
  if (this->idrup != 0) {
    this->idrup = 0;
  }
  if (this->ilb != 0) {
    this->ilb = 0;
  }
  if (this->ilbassumptions != 0) {
    this->ilbassumptions = 0;
  }
  if (this->inprocessing != 1) {
    this->inprocessing = 1;
  }
  if (this->instantiate != 0) {
    this->instantiate = 0;
  }
  if (this->instantiateclslim != 3) {
    this->instantiateclslim = 3;
  }
  if (this->instantiateocclim != 1) {
    this->instantiateocclim = 1;
  }
  if (this->instantiateonce != 1) {
    this->instantiateonce = 1;
  }
  if (this->lidrup != 0) {
    this->lidrup = 0;
  }
  if (this->lrat != 0) {
    this->lrat = 0;
  }
  if (this->lucky != 1) {
    this->lucky = 1;
  }
  if (this->minimize != 1) {
    this->minimize = 1;
  }
  if (((double)this->minimizedepth != 1000.0) || (NAN((double)this->minimizedepth))) {
    this->minimizedepth = 1000;
  }
  if (this->otfs != 1) {
    this->otfs = 1;
  }
  if (this->phase != 1) {
    this->phase = 1;
  }
  if (this->probe != 1) {
    this->probe = 1;
  }
  if (this->probehbr != 1) {
    this->probehbr = 1;
  }
  if (((double)this->probeint != 5000.0) || (NAN((double)this->probeint))) {
    this->probeint = 5000;
  }
  if (((double)this->probemaxeff != 100000000.0) || (NAN((double)this->probemaxeff))) {
    this->probemaxeff = 100000000;
  }
  if (((double)this->probemineff != 1000000.0) || (NAN((double)this->probemineff))) {
    this->probemineff = 1000000;
  }
  if (this->probereleff != 0x14) {
    this->probereleff = 0x14;
  }
  if (this->proberounds != 1) {
    this->proberounds = 1;
  }
  if (this->radixsortlim != 0x20) {
    this->radixsortlim = 0x20;
  }
  if (this->reduce != 1) {
    this->reduce = 1;
  }
  if (this->reduceint != 300) {
    this->reduceint = 300;
  }
  if (this->reducetarget != 0x4b) {
    this->reducetarget = 0x4b;
  }
  if (this->reducetier1glue != 2) {
    this->reducetier1glue = 2;
  }
  if (this->reducetier2glue != 6) {
    this->reducetier2glue = 6;
  }
  if (this->reluctant != 0x400) {
    this->reluctant = 0x400;
  }
  if (this->reluctantmax != 0x100000) {
    this->reluctantmax = 0x100000;
  }
  if (this->rephase != 1) {
    this->rephase = 1;
  }
  if (((double)this->rephaseint != 1000.0) || (NAN((double)this->rephaseint))) {
    this->rephaseint = 1000;
  }
  if (this->report != reportdefault) {
    this->report = reportdefault;
  }
  if (this->reportall != 0) {
    this->reportall = 0;
  }
  if (this->reportsolve != 0) {
    this->reportsolve = 0;
  }
  if (this->restart != 1) {
    this->restart = 1;
  }
  if (this->restartint != 2) {
    this->restartint = 2;
  }
  if (this->restartmargin != 10) {
    this->restartmargin = 10;
  }
  if (this->restartreusetrail != 1) {
    this->restartreusetrail = 1;
  }
  if (this->restoreall != 0) {
    this->restoreall = 0;
  }
  if (this->restoreflush != 0) {
    this->restoreflush = 0;
  }
  if (this->reverse != 0) {
    this->reverse = 0;
  }
  if (this->score != 1) {
    this->score = 1;
  }
  if (this->scorefactor != 0x3b6) {
    this->scorefactor = 0x3b6;
  }
  if (this->seed != 0) {
    this->seed = 0;
  }
  if (this->shrink != 3) {
    this->shrink = 3;
  }
  if (this->shrinkreap != 1) {
    this->shrinkreap = 1;
  }
  if (this->shuffle != 0) {
    this->shuffle = 0;
  }
  if (this->shufflequeue != 1) {
    this->shufflequeue = 1;
  }
  if (this->shufflerandom != 0) {
    this->shufflerandom = 0;
  }
  if (this->shufflescores != 1) {
    this->shufflescores = 1;
  }
  if (this->stabilize != 1) {
    this->stabilize = 1;
  }
  if (this->stabilizefactor != 200) {
    this->stabilizefactor = 200;
  }
  if (((double)this->stabilizeint != 1000.0) || (NAN((double)this->stabilizeint))) {
    this->stabilizeint = 1000;
  }
  if (((double)this->stabilizemaxint != 2000000000.0) || (NAN((double)this->stabilizemaxint))) {
    this->stabilizemaxint = 2000000000;
  }
  if (this->stabilizeonly != 0) {
    this->stabilizeonly = 0;
  }
  if (this->stats != 0) {
    this->stats = 0;
  }
  if (this->subsume != 1) {
    this->subsume = 1;
  }
  if (((double)this->subsumebinlim != 10000.0) || (NAN((double)this->subsumebinlim))) {
    this->subsumebinlim = 10000;
  }
  if (((double)this->subsumeclslim != 100.0) || (NAN((double)this->subsumeclslim))) {
    this->subsumeclslim = 100;
  }
  if (((double)this->subsumeint != 10000.0) || (NAN((double)this->subsumeint))) {
    this->subsumeint = 10000;
  }
  if (this->subsumelimited != 1) {
    this->subsumelimited = 1;
  }
  if (((double)this->subsumemaxeff != 100000000.0) || (NAN((double)this->subsumemaxeff))) {
    this->subsumemaxeff = 100000000;
  }
  if (((double)this->subsumemineff != 1000000.0) || (NAN((double)this->subsumemineff))) {
    this->subsumemineff = 1000000;
  }
  if (((double)this->subsumeocclim != 100.0) || (NAN((double)this->subsumeocclim))) {
    this->subsumeocclim = 100;
  }
  if (((double)this->subsumereleff != 1000.0) || (NAN((double)this->subsumereleff))) {
    this->subsumereleff = 1000;
  }
  if (this->subsumestr != 1) {
    this->subsumestr = 1;
  }
  if (this->target != 1) {
    this->target = 1;
  }
  if (this->terminateint != 10) {
    this->terminateint = 10;
  }
  if (this->ternary != 1) {
    this->ternary = 1;
  }
  if (((double)this->ternarymaxadd != 1000.0) || (NAN((double)this->ternarymaxadd))) {
    this->ternarymaxadd = 1000;
  }
  if (((double)this->ternarymaxeff != 100000000.0) || (NAN((double)this->ternarymaxeff))) {
    this->ternarymaxeff = 100000000;
  }
  if (((double)this->ternarymineff != 1000000.0) || (NAN((double)this->ternarymineff))) {
    this->ternarymineff = 1000000;
  }
  if (((double)this->ternaryocclim != 100.0) || (NAN((double)this->ternaryocclim))) {
    this->ternaryocclim = 100;
  }
  if (this->ternaryreleff != 10) {
    this->ternaryreleff = 10;
  }
  if (this->ternaryrounds != 2) {
    this->ternaryrounds = 2;
  }
  if (this->transred != 1) {
    this->transred = 1;
  }
  if (((double)this->transredmaxeff != 100000000.0) || (NAN((double)this->transredmaxeff))) {
    this->transredmaxeff = 100000000;
  }
  if (((double)this->transredmineff != 1000000.0) || (NAN((double)this->transredmineff))) {
    this->transredmineff = 1000000;
  }
  if (((double)this->transredreleff != 100.0) || (NAN((double)this->transredreleff))) {
    this->transredreleff = 100;
  }
  if (this->veripb != 0) {
    this->veripb = 0;
  }
  if (this->vivify != 1) {
    this->vivify = 1;
  }
  if (this->vivifyinst != 1) {
    this->vivifyinst = 1;
  }
  if (((double)this->vivifymaxeff != 20000000.0) || (NAN((double)this->vivifymaxeff))) {
    this->vivifymaxeff = 20000000;
  }
  if (((double)this->vivifymineff != 20000.0) || (NAN((double)this->vivifymineff))) {
    this->vivifymineff = 20000;
  }
  if (this->vivifyonce != 0) {
    this->vivifyonce = 0;
  }
  if (this->vivifyredeff != 0x4b) {
    this->vivifyredeff = 0x4b;
  }
  if (this->vivifyreleff != 0x14) {
    this->vivifyreleff = 0x14;
  }
  if (this->walk != 1) {
    this->walk = 1;
  }
  if (((double)this->walkmaxeff != 10000000.0) || (NAN((double)this->walkmaxeff))) {
    this->walkmaxeff = 10000000;
  }
  if (((double)this->walkmineff != 100000.0) || (NAN((double)this->walkmineff))) {
    this->walkmineff = 100000;
  }
  if (this->walknonstable != 1) {
    this->walknonstable = 1;
  }
  if (this->walkredundant != 0) {
    this->walkredundant = 0;
  }
  if (this->walkreleff != 0x14) {
    this->walkreleff = 0x14;
  }
  return;
}

Assistant:

void Options::reset_default_values () {
  size_t count = 0;
#define OPTION(N, V, L, H, O, P, R, D) \
  do { \
    if (!(R)) \
      break; \
    if (N == (V)) \
      break; \
    LOG ("resetting option '%s' to default %s", #N, #V); \
    count++; \
    N = (int) (V); \
  } while (0);
  OPTIONS
#undef OPTION
  LOG ("reset %zd options to their default values", count);
#ifndef LOGGING
  (void) count;
#endif
}